

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O1

IHEVCD_ERROR_T
ihevcd_short_term_ref_pic_set
          (bitstrm_t *ps_bitstrm,stref_picset_t *ps_stref_picset_base,
          WORD32 num_short_term_ref_pic_sets,WORD32 idx,stref_picset_t *ps_stref_picset)

{
  short sVar1;
  WORD16 WVar2;
  bool bVar3;
  WORD8 WVar4;
  char cVar5;
  UWORD32 UVar6;
  uint uVar7;
  int iVar8;
  UWORD32 UVar9;
  UWORD32 UVar10;
  ulong uVar11;
  char cVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint local_44;
  
  if (idx < 1) {
    cVar12 = '\0';
  }
  else {
    UVar6 = ihevcd_bits_get(ps_bitstrm,1);
    cVar12 = (char)UVar6;
  }
  ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = cVar12;
  if (cVar12 == '\0') {
    UVar9 = ihevcd_uev(ps_bitstrm);
    UVar10 = 0;
    UVar6 = UVar9;
    if ((char)UVar9 < '\0') {
      UVar6 = UVar10;
    }
    WVar4 = (WORD8)UVar6;
    if ('\x0f' < (char)UVar9) {
      WVar4 = '\x0f';
    }
    ps_stref_picset->i1_num_neg_pics = WVar4;
    UVar6 = ihevcd_uev(ps_bitstrm);
    cVar5 = (char)UVar6;
    iVar17 = 0xf - ps_stref_picset->i1_num_neg_pics;
    cVar12 = '\0';
    if (0 < cVar5) {
      cVar12 = cVar5;
    }
    if (iVar17 < cVar5) {
      cVar12 = (char)iVar17;
    }
    ps_stref_picset->i1_num_pos_pics = cVar12;
    ps_stref_picset->i1_num_delta_pocs = cVar12 + ps_stref_picset->i1_num_neg_pics;
    cVar12 = ps_stref_picset->i1_num_neg_pics;
    if ('\0' < cVar12) {
      lVar20 = 0;
      do {
        UVar6 = ihevcd_uev(ps_bitstrm);
        UVar10 = UVar10 + ~UVar6;
        ps_stref_picset->ai2_delta_poc[lVar20] = (WORD16)UVar10;
        UVar6 = ihevcd_bits_get(ps_bitstrm,1);
        ps_stref_picset->ai1_used[lVar20] = (WORD8)UVar6;
        lVar20 = lVar20 + 1;
        cVar12 = ps_stref_picset->i1_num_neg_pics;
      } while (lVar20 < cVar12);
    }
    if (cVar12 < ps_stref_picset->i1_num_delta_pocs) {
      lVar20 = (long)cVar12;
      iVar17 = 0;
      do {
        UVar6 = ihevcd_uev(ps_bitstrm);
        iVar17 = iVar17 + UVar6 + 1;
        ps_stref_picset->ai2_delta_poc[lVar20] = (WORD16)iVar17;
        UVar6 = ihevcd_bits_get(ps_bitstrm,1);
        ps_stref_picset->ai1_used[lVar20] = (WORD8)UVar6;
        lVar20 = lVar20 + 1;
      } while (lVar20 < ps_stref_picset->i1_num_delta_pocs);
    }
  }
  else {
    uVar7 = 0xffffffff;
    if (idx == num_short_term_ref_pic_sets) {
      UVar6 = ihevcd_uev(ps_bitstrm);
      uVar7 = ~UVar6;
    }
    iVar8 = uVar7 + idx;
    iVar17 = 0;
    if (0 < iVar8) {
      iVar17 = iVar8;
    }
    if (idx <= iVar8) {
      iVar17 = idx + -1;
    }
    UVar6 = ihevcd_bits_get(ps_bitstrm,1);
    UVar9 = ihevcd_uev(ps_bitstrm);
    cVar12 = ps_stref_picset_base[iVar17].i1_num_delta_pocs;
    uVar7 = 0;
    local_44 = 0;
    if (-1 < cVar12) {
      iVar8 = 0;
      local_44 = 0;
      uVar7 = 0;
      lVar20 = 0;
      do {
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        ps_stref_picset->ai1_used[iVar8] = (WORD8)UVar10;
        if (UVar10 == 0) {
          UVar10 = ihevcd_bits_get(ps_bitstrm,1);
          UVar10 = UVar10 * 2;
        }
        if (UVar10 - 1 < 2) {
          iVar13 = 0;
          if (lVar20 < ps_stref_picset_base[iVar17].i1_num_delta_pocs) {
            iVar13 = (int)ps_stref_picset_base[iVar17].ai2_delta_poc[lVar20];
          }
          uVar14 = iVar13 + (UVar6 * -2 + 1) * (UVar9 + 1);
          ps_stref_picset->ai2_delta_poc[iVar8] = (WORD16)uVar14;
          uVar7 = uVar7 - ((int)uVar14 >> 0x1f);
          local_44 = local_44 - ((int)~uVar14 >> 0x1f);
          iVar8 = iVar8 + 1;
        }
        ps_stref_picset->ai1_ref_idc[lVar20] = (WORD8)UVar10;
        cVar12 = ps_stref_picset_base[iVar17].i1_num_delta_pocs;
        bVar3 = lVar20 < cVar12;
        lVar20 = lVar20 + 1;
      } while (bVar3);
    }
    uVar14 = 0;
    if (0 < (int)uVar7) {
      uVar14 = uVar7;
    }
    uVar11 = 0xf;
    if ((int)uVar14 < 0xf) {
      uVar11 = (ulong)uVar14;
    }
    uVar15 = (uint)uVar11 ^ 0xf;
    uVar14 = 0;
    if (0 < (int)local_44) {
      uVar14 = local_44;
    }
    if ((int)uVar15 < (int)local_44) {
      uVar14 = uVar15;
    }
    uVar15 = (uint)uVar11 + uVar14;
    ps_stref_picset->i1_num_ref_idc = cVar12 + '\x01';
    ps_stref_picset->i1_num_delta_pocs = (WORD8)uVar15;
    ps_stref_picset->i1_num_pos_pics = (WORD8)uVar14;
    ps_stref_picset->i1_num_neg_pics = (WORD8)uVar11;
    if (1 < uVar15) {
      uVar16 = 1;
      uVar18 = 0;
      do {
        sVar1 = ps_stref_picset->ai2_delta_poc[uVar16];
        WVar4 = ps_stref_picset->ai1_used[uVar16];
        uVar19 = uVar18;
        do {
          uVar21 = uVar19 & 0xffffffff;
          if (sVar1 < ps_stref_picset->ai2_delta_poc[uVar21]) {
            ps_stref_picset->ai2_delta_poc[uVar19 + 1] = ps_stref_picset->ai2_delta_poc[uVar21];
            ps_stref_picset->ai1_used[uVar19 + 1] = ps_stref_picset->ai1_used[uVar21];
            ps_stref_picset->ai2_delta_poc[uVar21] = sVar1;
            ps_stref_picset->ai1_used[uVar21] = WVar4;
          }
          lVar20 = uVar19 + 1;
          uVar19 = uVar19 - 1;
        } while (1 < lVar20);
        uVar16 = uVar16 + 1;
        uVar18 = uVar18 + 1;
      } while (uVar16 != uVar15);
    }
    if (1 < (int)uVar7) {
      uVar16 = uVar11 >> 1;
      uVar18 = 0;
      do {
        WVar2 = ps_stref_picset->ai2_delta_poc[uVar18];
        WVar4 = ps_stref_picset->ai1_used[uVar18];
        ps_stref_picset->ai2_delta_poc[uVar18] = ps_stref_picset->ai2_delta_poc[uVar11 - 1];
        ps_stref_picset->ai1_used[uVar18] = ps_stref_picset->ai1_used[uVar11 - 1];
        ps_stref_picset->ai2_delta_poc[uVar11 - 1] = WVar2;
        ps_stref_picset->ai1_used[uVar11 - 1] = WVar4;
        uVar11 = uVar11 - 1;
        uVar18 = uVar18 + 1;
      } while (uVar16 != uVar18);
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_short_term_ref_pic_set(bitstrm_t *ps_bitstrm,
                                             stref_picset_t *ps_stref_picset_base,
                                             WORD32 num_short_term_ref_pic_sets,
                                             WORD32 idx,
                                             stref_picset_t *ps_stref_picset)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    stref_picset_t *ps_stref_picset_ref;
    WORD32 delta_idx, delta_rps;
    WORD32 r_idx;
    WORD32 i;
    WORD32 j, k, temp;
    if(idx > 0)
    {
        BITS_PARSE("inter_ref_pic_set_prediction_flag", value, ps_bitstrm, 1);
        ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = value;
    }
    else
        ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = 0;

    if(ps_stref_picset->i1_inter_ref_pic_set_prediction_flag)
    {
        WORD32 delta_rps_sign;
        WORD32 abs_delta_rps;
        WORD32 num_neg_pics = 0;
        WORD32 num_pos_pics = 0;
        WORD32 num_pics = 0;

        if(idx == num_short_term_ref_pic_sets)
        {
            UEV_PARSE("delta_idx_minus1", value, ps_bitstrm);
            delta_idx = value + 1;
        }
        else
        {
            delta_idx = 1;
        }
        r_idx = idx - delta_idx;
        r_idx = CLIP3(r_idx, 0, idx - 1);

        ps_stref_picset_ref = ps_stref_picset_base + r_idx;

        BITS_PARSE("delta_rps_sign", value, ps_bitstrm, 1);
        delta_rps_sign = value;

        UEV_PARSE("abs_delta_rps_minus1", value, ps_bitstrm);
        abs_delta_rps = value + 1;

        delta_rps = (1 - 2 * delta_rps_sign) * (abs_delta_rps);



        for(i = 0; i <= ps_stref_picset_ref->i1_num_delta_pocs; i++)
        {
            WORD32 ref_idc;

            /*****************************************************************/
            /* ref_idc is parsed as below                                    */
            /* bits "1" ref_idc 1                                            */
            /* bits "01" ref_idc 2                                           */
            /* bits "00" ref_idc 0                                           */
            /*****************************************************************/
            BITS_PARSE("used_by_curr_pic_flag", value, ps_bitstrm, 1);
            ref_idc = value;
            ps_stref_picset->ai1_used[num_pics] = value;
            /* If ref_idc is zero check for next bit */
            if(0 == ref_idc)
            {
                BITS_PARSE("use_delta_flag", value, ps_bitstrm, 1);
                ref_idc = value << 1;
            }
            if((ref_idc == 1) || (ref_idc == 2))
            {
                WORD32 delta_poc;
                delta_poc = delta_rps;
                delta_poc +=
                                ((i < ps_stref_picset_ref->i1_num_delta_pocs) ?
                                ps_stref_picset_ref->ai2_delta_poc[i] :
                                0);

                ps_stref_picset->ai2_delta_poc[num_pics] = delta_poc;

                if(delta_poc < 0)
                {
                    num_neg_pics++;
                }
                else
                {
                    num_pos_pics++;
                }
                num_pics++;
            }
            ps_stref_picset->ai1_ref_idc[i] = ref_idc;
        }

        num_neg_pics = CLIP3(num_neg_pics, 0, MAX_DPB_SIZE - 1);
        num_pos_pics = CLIP3(num_pos_pics, 0, (MAX_DPB_SIZE - 1 - num_neg_pics));
        num_pics = num_neg_pics + num_pos_pics;

        ps_stref_picset->i1_num_ref_idc =
                        ps_stref_picset_ref->i1_num_delta_pocs + 1;
        ps_stref_picset->i1_num_delta_pocs = num_pics;
        ps_stref_picset->i1_num_pos_pics = num_pos_pics;
        ps_stref_picset->i1_num_neg_pics = num_neg_pics;


        for(j = 1; j < num_pics; j++)
        {
            WORD32 delta_poc = ps_stref_picset->ai2_delta_poc[j];
            WORD8 i1_used = ps_stref_picset->ai1_used[j];
            for(k = j - 1; k >= 0; k--)
            {
                temp = ps_stref_picset->ai2_delta_poc[k];
                if(delta_poc < temp)
                {
                    ps_stref_picset->ai2_delta_poc[k + 1] = temp;
                    ps_stref_picset->ai1_used[k + 1] = ps_stref_picset->ai1_used[k];
                    ps_stref_picset->ai2_delta_poc[k] = delta_poc;
                    ps_stref_picset->ai1_used[k] = i1_used;
                }
            }
        }
        // flip the negative values to largest first
        for(j = 0, k = num_neg_pics - 1; j < num_neg_pics >> 1; j++, k--)
        {
            WORD32 delta_poc = ps_stref_picset->ai2_delta_poc[j];
            WORD8 i1_used = ps_stref_picset->ai1_used[j];
            ps_stref_picset->ai2_delta_poc[j] = ps_stref_picset->ai2_delta_poc[k];
            ps_stref_picset->ai1_used[j] = ps_stref_picset->ai1_used[k];
            ps_stref_picset->ai2_delta_poc[k] = delta_poc;
            ps_stref_picset->ai1_used[k] = i1_used;
        }

    }
    else
    {
        WORD32 prev_poc = 0;
        WORD32 poc;

        UEV_PARSE("num_negative_pics", value, ps_bitstrm);
        ps_stref_picset->i1_num_neg_pics = value;
        ps_stref_picset->i1_num_neg_pics = CLIP3(ps_stref_picset->i1_num_neg_pics,
                                                 0,
                                                 MAX_DPB_SIZE - 1);

        UEV_PARSE("num_positive_pics", value, ps_bitstrm);
        ps_stref_picset->i1_num_pos_pics = value;
        ps_stref_picset->i1_num_pos_pics = CLIP3(ps_stref_picset->i1_num_pos_pics,
                                                 0,
                                                 (MAX_DPB_SIZE - 1 - ps_stref_picset->i1_num_neg_pics));

        ps_stref_picset->i1_num_delta_pocs =
                        ps_stref_picset->i1_num_neg_pics +
                        ps_stref_picset->i1_num_pos_pics;


        for(i = 0; i < ps_stref_picset->i1_num_neg_pics; i++)
        {
            UEV_PARSE("delta_poc_s0_minus1", value, ps_bitstrm);
            poc = prev_poc - (value + 1);
            prev_poc = poc;
            ps_stref_picset->ai2_delta_poc[i] = poc;

            BITS_PARSE("used_by_curr_pic_s0_flag", value, ps_bitstrm, 1);
            ps_stref_picset->ai1_used[i] = value;

        }
        prev_poc = 0;
        for(i = ps_stref_picset->i1_num_neg_pics;
                        i < ps_stref_picset->i1_num_delta_pocs;
                        i++)
        {
            UEV_PARSE("delta_poc_s1_minus1", value, ps_bitstrm);
            poc = prev_poc + (value + 1);
            prev_poc = poc;
            ps_stref_picset->ai2_delta_poc[i] = poc;

            BITS_PARSE("used_by_curr_pic_s1_flag", value, ps_bitstrm, 1);
            ps_stref_picset->ai1_used[i] = value;

        }

    }

    return ret;
}